

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O1

void __thiscall
Rml::ElementDocument::Show(ElementDocument *this,ModalFlag modal_flag,FocusFlag focus_flag)

{
  ElementDocument *this_00;
  ElementDocument *pEVar1;
  byte bVar2;
  ElementDocument *pEVar3;
  bool bVar4;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_60;
  PropertyDefinition *local_58;
  int local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  if (modal_flag == None) {
    bVar4 = false;
  }
  else {
    if (modal_flag != Modal) goto LAB_0022834c;
    bVar4 = true;
  }
  this->modal = bVar4;
LAB_0022834c:
  bVar4 = focus_flag < 4;
  bVar2 = (byte)focus_flag & 0xf;
  local_88._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x2d;
  Variant::Set((Variant *)local_88,0);
  local_60._0_4_ = KEYWORD;
  local_60._4_4_ = -1;
  local_58 = (PropertyDefinition *)0x0;
  local_50 = -1;
  local_48 = (element_type *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(&this->super_Element,Visibility,(Property *)local_88);
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  Variant::~Variant((Variant *)local_88);
  UpdateDocument(this);
  if ((0xeU >> bVar2 & bVar4) != 0) {
    pEVar1 = this;
    if ((8U >> bVar2 & bVar4) == 0) {
      if ((bVar4 & 4U >> bVar2) != 0) {
        pEVar1 = (ElementDocument *)Element::GetFocusLeafNode(&this->super_Element);
      }
    }
    else {
      this_00 = (ElementDocument *)FindNextTabElement(this,&this->super_Element,true);
      if (this_00 != (ElementDocument *)0x0) {
        pEVar3 = (ElementDocument *)0x0;
        do {
          if (pEVar3 == (ElementDocument *)0x0) {
            pEVar3 = this_00;
          }
          local_88._0_8_ = &local_78;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"autofocus","");
          bVar4 = Element::HasAttribute(&this_00->super_Element,(String *)local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._0_8_ != &local_78) {
            operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
          }
          pEVar1 = this_00;
        } while (((!bVar4) &&
                 (this_00 = (ElementDocument *)FindNextTabElement(this,&this_00->super_Element,true)
                 , pEVar1 = this, this_00 != (ElementDocument *)0x0)) && (this_00 != pEVar3));
      }
    }
    bVar4 = Element::Focus(&pEVar1->super_Element,true);
    if (pEVar1 != this && bVar4) {
      Element::ScrollIntoView(&pEVar1->super_Element,false);
    }
  }
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78._M_allocated_capacity = 0;
  Element::DispatchEvent(&this->super_Element,Show,(Dictionary *)local_88);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)local_88);
  return;
}

Assistant:

void ElementDocument::Show(ModalFlag modal_flag, FocusFlag focus_flag)
{
	switch (modal_flag)
	{
	case ModalFlag::None: modal = false; break;
	case ModalFlag::Modal: modal = true; break;
	case ModalFlag::Keep: break;
	}

	bool focus = false;
	bool autofocus = false;
	bool focus_previous = false;

	switch (focus_flag)
	{
	case FocusFlag::None: break;
	case FocusFlag::Document: focus = true; break;
	case FocusFlag::Keep:
		focus = true;
		focus_previous = true;
		break;
	case FocusFlag::Auto:
		focus = true;
		autofocus = true;
		break;
	}

	// Set to visible and switch focus if necessary.
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));

	// Update the document now, otherwise the focusing methods below do not think we are visible. This is also important
	// to ensure correct layout for any event handlers, such as for focused input fields to submit the proper caret
	// position.
	UpdateDocument();

	if (focus)
	{
		Element* focus_element = this;

		if (autofocus)
		{
			Element* first_element = nullptr;
			Element* element = FindNextTabElement(this, true);

			while (element && element != first_element)
			{
				if (!first_element)
					first_element = element;

				if (element->HasAttribute("autofocus"))
				{
					focus_element = element;
					break;
				}

				element = FindNextTabElement(element, true);
			}
		}
		else if (focus_previous)
		{
			focus_element = GetFocusLeafNode();
		}

		// Focus the window or element
		bool focused = focus_element->Focus(true);
		if (focused && focus_element != this)
			focus_element->ScrollIntoView(false);
	}

	DispatchEvent(EventId::Show, Dictionary());
}